

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compression_utils.cpp
# Opt level: O2

void convertIntArray2ByteArray_fast_1b_to_result_sz
               (uchar *intArray,size_t intArrayLength,uchar **compressed_pos)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != ((intArrayLength >> 3) + 1) - (ulong)((intArrayLength & 7) == 0);
      lVar5 = lVar5 + 1) {
    bVar4 = 0;
    for (uVar2 = 0; (uVar2 < 8 && (uVar6 + uVar2 < intArrayLength)); uVar2 = uVar2 + 1) {
      bVar3 = 0x80 >> ((byte)uVar2 & 0x1f);
      if (intArray[uVar2 + uVar6] != '\x01') {
        bVar3 = 0;
      }
      bVar4 = bVar3 | bVar4;
    }
    pbVar1 = *compressed_pos;
    *compressed_pos = pbVar1 + 1;
    *pbVar1 = bVar4;
    uVar6 = uVar6 + uVar2;
  }
  return;
}

Assistant:

void 
convertIntArray2ByteArray_fast_1b_to_result_sz(const unsigned char* intArray, size_t intArrayLength, unsigned char *& compressed_pos){
	size_t byteLength = 0;
	size_t i, j; 
	if(intArrayLength%8==0)
		byteLength = intArrayLength/8;
	else
		byteLength = intArrayLength/8+1;
		
	size_t n = 0;
	int tmp, type;
	for(i = 0;i<byteLength;i++){
		tmp = 0;
		for(j = 0;j<8&&n<intArrayLength;j++){
			type = intArray[n];
			if(type == 1)
				tmp = (tmp | (1 << (7-j)));
			n++;
		}
    	*(compressed_pos++) = (unsigned char)tmp;
	}
}